

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string ** google::protobuf::internal::MakeDenseEnumCache_abi_cxx11_
                    (EnumDescriptor *desc,int min_val,int max_val)

{
  int iVar1;
  string **__s;
  Nonnull<const_char_*> pcVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long v1;
  long lVar6;
  
  iVar4 = max_val - min_val;
  uVar3 = 0xffffffffffffffff;
  if (-2 < iVar4) {
    uVar3 = (long)iVar4 * 8 + 8;
  }
  __s = (string **)operator_new__(uVar3);
  memset(__s,0,uVar3);
  iVar1 = desc->value_count_;
  if (0 < (long)iVar1) {
    lVar5 = 8;
    v1 = 0;
    do {
      if (v1 < desc->value_count_) {
        pcVar2 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,(long)desc->value_count_,"index < value_count()");
      }
      if (pcVar2 != (Nonnull<const_char_*>)0x0) {
        MakeDenseEnumCache_abi_cxx11_();
LAB_001ee483:
        MakeDenseEnumCache_abi_cxx11_();
      }
      lVar6 = (long)*(int *)((long)desc->values_ + lVar5 + -4) - (long)min_val;
      if (__s[lVar6] == (string *)0x0) {
        if (v1 < desc->value_count_) {
          pcVar2 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (v1,(long)desc->value_count_,"index < value_count()");
        }
        if (pcVar2 != (Nonnull<const_char_*>)0x0) goto LAB_001ee483;
        __s[lVar6] = *(string **)(&desc->values_->super_SymbolBaseN<0> + lVar5);
      }
      v1 = v1 + 1;
      lVar5 = lVar5 + 0x30;
    } while (iVar1 != v1);
  }
  if (-1 < iVar4) {
    uVar3 = 0;
    do {
      if (__s[uVar3] == (string *)0x0) {
        __s[uVar3] = (string *)&fixed_address_empty_string;
      }
      uVar3 = uVar3 + 1;
    } while (iVar4 + 1 != uVar3);
  }
  return __s;
}

Assistant:

const std::string** MakeDenseEnumCache(const EnumDescriptor* desc, int min_val,
                                       int max_val) {
  auto* str_ptrs =
      new const std::string*[static_cast<size_t>(max_val - min_val + 1)]();
  const int count = desc->value_count();
  for (int i = 0; i < count; ++i) {
    const int num = desc->value(i)->number();
    if (str_ptrs[num - min_val] == nullptr) {
      // Don't over-write an existing entry, because in case of duplication, the
      // first one wins.
      str_ptrs[num - min_val] = &internal::NameOfEnumAsString(desc->value(i));
    }
  }
  // Change any unfilled entries to point to the empty string.
  for (int i = 0; i < max_val - min_val + 1; ++i) {
    if (str_ptrs[i] == nullptr) str_ptrs[i] = &GetEmptyStringAlreadyInited();
  }
  return str_ptrs;
}